

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_16x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  int8_t *piVar5;
  undefined7 in_register_00000009;
  __m256i *in;
  __m256i buf0 [16];
  __m256i buf1 [16];
  longlong local_460 [64];
  longlong local_260 [70];
  
  piVar5 = av1_fwd_txfm_shift_ls[2];
  uVar3 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar1 = *(code **)((long)col_txfm16x16_arr + (ulong)(uVar3 * 8));
  pcVar2 = *(code **)((long)row_txfm16x16_arr + (ulong)(uVar3 * 8));
  bVar4 = false;
  if (uVar3 < 0x10) {
    if ((0x4110U >> (uVar3 & 0x1f) & 1) != 0) {
      bVar4 = false;
LAB_009f4604:
      load_buffer_16bit_to_16bit_flip_avx2(input,stride,(__m256i *)local_460,0x10);
      goto LAB_009f4616;
    }
    if ((0x80a0U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 6) {
        bVar4 = true;
        goto LAB_009f4604;
      }
    }
    else {
      bVar4 = true;
    }
  }
  load_buffer_16bit_to_16bit_avx2(input,stride,(__m256i *)local_460,0x10);
LAB_009f4616:
  round_shift_16bit_w16_avx2((__m256i *)local_460,0x10,(int)*piVar5);
  (*pcVar1)((__m256i *)local_460,(__m256i *)local_460,0xd);
  round_shift_16bit_w16_avx2((__m256i *)local_460,0x10,(int)piVar5[1]);
  transpose_16bit_16x16_avx2((__m256i *)local_460,(__m256i *)local_260);
  in = (__m256i *)local_260;
  if (bVar4) {
    flip_buf_avx2((__m256i *)local_260,(__m256i *)local_460,0x10);
    in = (__m256i *)local_460;
  }
  (*pcVar2)(in,in,0xc);
  round_shift_16bit_w16_avx2(in,0x10,(int)piVar5[2]);
  store_buffer_16bit_to_32bit_w16_avx2(in,output,0x10,0x10);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_16X16;
  __m256i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int32_t i = 0;
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
  }
  round_shift_16bit_w16_avx2(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit_w16_avx2(buf0, height, shift[1]);
  transpose_16bit_16x16_avx2(buf0, buf1 + 0 * width + 16 * i);

  __m256i *buf;
  if (lr_flip) {
    buf = buf0;
    flip_buf_avx2(buf1 + width * i, buf, width);
  } else {
    buf = buf1 + width * i;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit_w16_avx2(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height, width);
}